

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufAddToQue(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Flt_t *p_00;
  Vec_Que_t *pVVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  iVar2 = Abc_ObjFanoutNum(pObj);
  if ((p->nFanMin <= iVar2) && ((p->fBufPis != 0 || (iVar2 = Abc_ObjIsCi(pObj), iVar2 == 0)))) {
    p_00 = p->vCounts;
    uVar3 = Abc_ObjId(pObj);
    iVar2 = Abc_ObjFanoutNum(pObj);
    Vec_FltWriteEntry(p_00,uVar3,(float)iVar2);
    pVVar1 = p->vQue;
    uVar3 = Abc_ObjId(pObj);
    iVar2 = Vec_QueIsMember(pVVar1,uVar3);
    if (iVar2 == 0) {
      pVVar1 = p->vQue;
      uVar3 = Abc_ObjId(pObj);
      Vec_QuePush(pVVar1,uVar3);
    }
    else {
      pVVar1 = p->vQue;
      uVar3 = Abc_ObjId(pObj);
      Vec_QueUpdate(pVVar1,uVar3);
    }
  }
  return;
}

Assistant:

void Abc_BufAddToQue( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    if ( Abc_ObjFanoutNum(pObj) < p->nFanMin || (!p->fBufPis && Abc_ObjIsCi(pObj)) )
        return;
    Vec_FltWriteEntry( p->vCounts, Abc_ObjId(pObj), Abc_ObjFanoutNum(pObj) );
    if ( Vec_QueIsMember(p->vQue, Abc_ObjId(pObj)) )
        Vec_QueUpdate( p->vQue, Abc_ObjId(pObj) );
    else
        Vec_QuePush( p->vQue, Abc_ObjId(pObj) );
}